

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

ostream * dump_generic_port(ostream *o,string *name,string *doc,string *type)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  char *__s;
  string args;
  string arg_names;
  allocator<char> local_e1;
  string *local_e0;
  string *local_d8;
  undefined1 *local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  long local_50 [4];
  
  __s = (type->_M_dataplus)._M_p;
  local_e0 = doc;
  local_d8 = name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"xyzabcdefghijklmnopqrstuvw",(allocator<char> *)&local_d0);
  if (*__s == ':') {
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    while( true ) {
      __s = __s + 1;
      if ((*__s == '\0') || (*__s == ':')) break;
      std::__cxx11::string::push_back((char)&local_d0);
    }
    poVar1 = std::operator<<(o," <message_in pattern=\"");
    poVar1 = std::operator<<(poVar1,(string *)local_d8);
    poVar1 = std::operator<<(poVar1,"\" typetag=\"");
    poVar1 = std::operator<<(poVar1,(string *)&local_d0);
    std::operator<<(poVar1,"\">\n");
    poVar1 = std::operator<<(o,"  <desc>");
    poVar1 = std::operator<<(poVar1,(string *)local_e0);
    std::operator<<(poVar1,"</desc>\n");
    for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < local_c8; uVar2 = uVar2 + 1) {
      poVar1 = std::operator<<(o,"  <param_");
      poVar1 = std::operator<<(poVar1,local_d0[uVar3]);
      poVar1 = std::operator<<(poVar1," symbol=\"");
      poVar1 = std::operator<<(poVar1,*(char *)(local_50[0] + uVar3));
      std::operator<<(poVar1,"\"/>\n");
    }
    std::operator<<(o," </message_in>\n");
    if (*__s == ':') {
      std::__cxx11::string::string((string *)&local_70,(string *)local_d8);
      std::__cxx11::string::string((string *)&local_90,(string *)local_e0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_e1);
      o = dump_generic_port(o,&local_70,&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)local_50);
  return o;
}

Assistant:

static ostream &dump_generic_port(ostream &o, string name, string doc, string type)
{
    const char *t = type.c_str();
    string arg_names = "xyzabcdefghijklmnopqrstuvw";

    //start out with argument separator
    if(*t++ != ':')
        return o;
    //now real arguments (assume [] don't exist)
    string args;
    while(*t && *t != ':')
        args += *t++;

    o << " <message_in pattern=\"" << name << "\" typetag=\"" << args << "\">\n";
    o << "  <desc>" << doc << "</desc>\n";

    assert(args.length()<arg_names.length());
    for(unsigned i=0; i<args.length(); ++i)
        o << "  <param_" << args[i] << " symbol=\"" << arg_names[i] << "\"/>\n";
    o << " </message_in>\n";

    if(*t == ':')
        return dump_generic_port(o, name, doc, t);
    else
        return o;
}